

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O1

void expr_list(t_expr *x,t_symbol *s,int argc,t_atom *argv)

{
  ulong uVar1;
  word wVar2;
  _outlet *x_00;
  long lVar3;
  long lVar4;
  _outlet **pp_Var5;
  word *pwVar6;
  ex_ex *optr;
  t_float f;
  
  if (0 < argc) {
    uVar1 = 100;
    if (argc < 100) {
      uVar1 = (ulong)(uint)argc;
    }
    pwVar6 = &argv->a_w;
    lVar4 = 0;
    do {
      if ((float)((t_atom *)(pwVar6 + -1))->a_type == 2.8026e-45) {
        lVar3 = *(long *)((long)&x->exp_var[0].ex_type + lVar4);
        if (lVar3 != 0) {
          if (lVar3 == 0xd) {
            wVar2 = *pwVar6;
            goto LAB_0019f4fb;
          }
LAB_0019f4e7:
          pd_error(x,"expr: type mismatch");
        }
      }
      else if (((float)((t_atom *)(pwVar6 + -1))->a_type == 1.4013e-45) &&
              (lVar3 = *(long *)((long)&x->exp_var[0].ex_type + lVar4), lVar3 != 0)) {
        if (lVar3 == 0xb) {
          wVar2 = (word)(long)pwVar6->w_float;
LAB_0019f4fb:
          *(word *)((long)&x->exp_var[0].ex_cont + lVar4) = wVar2;
        }
        else {
          if (lVar3 != 0xc) goto LAB_0019f4e7;
          *(t_float *)((long)&x->exp_var[0].ex_cont + lVar4) = pwVar6->w_float;
        }
      }
      lVar4 = lVar4 + 0x18;
      pwVar6 = pwVar6 + 2;
    } while (uVar1 * 0x18 != lVar4);
  }
  if (((x->exp_flags & 6) == 0) && (lVar4 = (long)x->exp_nexpr, 0 < lVar4)) {
    lVar3 = lVar4 + 1;
    pp_Var5 = x->exp_outlet + lVar4 + -1;
    optr = x->exp_res + lVar4 + -1;
    do {
      ex_eval(x,(ex_ex *)pp_Var5[0x65],optr,0);
      if (optr->ex_type == 2) {
        x_00 = *pp_Var5;
        f = (optr->ex_cont).v_flt;
LAB_0019f580:
        outlet_float(x_00,f);
      }
      else {
        if (optr->ex_type == 1) {
          x_00 = *pp_Var5;
          f = (t_float)(optr->ex_cont).v_int;
          goto LAB_0019f580;
        }
        post("expr: bang: unrecognized result %ld\n");
      }
      lVar3 = lVar3 + -1;
      pp_Var5 = pp_Var5 + -1;
      optr = optr + -1;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

static void
expr_list(t_expr *x, t_symbol *s, int argc, const fts_atom_t *argv)
{
        int i;

        if (argc > MAX_VARS) argc = MAX_VARS;

        for (i = 0; i < argc; i++)
        {
                if (argv[i].a_type == A_FLOAT)
                {
                        if (x->exp_var[i].ex_type == ET_FI)
                                x->exp_var[i].ex_flt = argv[i].a_w.w_float;
                        else if (x->exp_var[i].ex_type == ET_II)
                                x->exp_var[i].ex_int = argv[i].a_w.w_float;
                        else if (x->exp_var[i].ex_type)
                            pd_error(x, "expr: type mismatch");
                }
                else if (argv[i].a_type == A_SYMBOL)
                {
                        if (x->exp_var[i].ex_type == ET_SI)
                                x->exp_var[i].ex_ptr = (char *)argv[i].a_w.w_symbol;
                        else if (x->exp_var[i].ex_type)
                            pd_error(x, "expr: type mismatch");
                }
        }
        expr_bang(x);
}